

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O2

string * Corrade::Utility::String::ltrim
                   (string *__return_storage_ptr__,string *string,string *characters)

{
  size_t in_R8;
  ArrayView<const_char> characters_00;
  string asStack_38 [32];
  
  std::__cxx11::string::string(asStack_38,(string *)string);
  characters_00._size = in_R8;
  characters_00._data = (char *)characters->_M_string_length;
  Implementation::ltrim
            (__return_storage_ptr__,(Implementation *)asStack_38,
             (string *)(characters->_M_dataplus)._M_p,characters_00);
  std::__cxx11::string::~string(asStack_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ltrim(std::string string, const std::string& characters) {
    return Implementation::ltrim(std::move(string), {characters.data(), characters.size()});
}